

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O0

QList<QNetworkCookie> * __thiscall
QNetworkCookieJar::cookiesForUrl(QNetworkCookieJar *this,QUrl *url)

{
  QStringView domain_00;
  QStringView reference;
  QStringView path;
  QStringView domain_01;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  QNetworkCookieJarPrivate *pQVar5;
  iterator iVar6;
  iterator iVar7;
  QStringView *in_RDX;
  QList<QNetworkCookie> *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar8;
  QNetworkCookie *cookie;
  add_const_t<const_QList<QNetworkCookie>_> *__range1;
  bool isEncrypted;
  QNetworkCookieJarPrivate *d;
  QList<QNetworkCookie> *result;
  anon_class_1_0_00000001 longerPath;
  QStringView domain;
  QString cookieDomain;
  QString urlHost;
  const_iterator __end1;
  const_iterator __begin1;
  QDateTime now;
  undefined4 in_stack_fffffffffffffe18;
  ComponentFormattingOption in_stack_fffffffffffffe1c;
  QStringView *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  byte in_stack_fffffffffffffe2f;
  QStringView *this_00;
  QChar c;
  QList<QNetworkCookie> *pQVar9;
  undefined6 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  storage_type_conflict *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe6c;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 uVar10;
  qsizetype local_130;
  storage_type_conflict *local_128;
  QChar local_11a;
  qsizetype local_118;
  storage_type_conflict *local_110;
  undefined1 local_d8 [72];
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  QDateTime local_58 [8];
  QNetworkCookie *local_50;
  const_iterator local_48;
  const_iterator local_40;
  QLatin1StringView local_38;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = in_RDI;
  pQVar5 = d_func((QNetworkCookieJar *)0x1c041b);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QDateTime::currentDateTimeUtc();
  uVar10 = 0;
  (pQVar9->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (pQVar9->d).ptr = (QNetworkCookie *)0xaaaaaaaaaaaaaaaa;
  (pQVar9->d).size = -0x5555555555555556;
  QList<QNetworkCookie>::QList((QList<QNetworkCookie> *)0x1c046b);
  QUrl::scheme();
  local_38 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                        (size_t)in_stack_fffffffffffffe20);
  bVar1 = ::operator==((QString *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                       (QLatin1StringView *)in_stack_fffffffffffffe20);
  QString::~QString((QString *)0x1c04c4);
  bVar2 = bVar1 & 1;
  local_40.i = (QNetworkCookie *)0xaaaaaaaaaaaaaaaa;
  local_40 = QList<QNetworkCookie>::begin((QList<QNetworkCookie> *)in_stack_fffffffffffffe20);
  local_48.i = (QNetworkCookie *)0xaaaaaaaaaaaaaaaa;
  local_48 = QList<QNetworkCookie>::end((QList<QNetworkCookie> *)in_stack_fffffffffffffe20);
  while( true ) {
    local_50 = local_48.i;
    bVar3 = QList<QNetworkCookie>::const_iterator::operator!=(&local_40,local_48);
    if (!bVar3) break;
    QList<QNetworkCookie>::const_iterator::operator*(&local_40);
    if (((bVar2 & 1) != 0) || (bVar3 = QNetworkCookie::isSecure((QNetworkCookie *)0x1c058d), !bVar3)
       ) {
      bVar4 = QNetworkCookie::isSessionCookie((QNetworkCookie *)0x1c05a2);
      in_stack_fffffffffffffe6c = in_stack_fffffffffffffe6c & 0xffffff;
      bVar3 = false;
      if (!bVar4) {
        QNetworkCookie::expirationDate
                  ((QNetworkCookie *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
        in_stack_fffffffffffffe6c = CONCAT13(1,(int3)in_stack_fffffffffffffe6c);
        bVar3 = ::operator<((QDateTime *)in_stack_fffffffffffffe20,
                            (QDateTime *)
                            CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      }
      c.ucs = CONCAT11(bVar3,bVar3);
      if ((in_stack_fffffffffffffe6c & 0x1000000) != 0) {
        QDateTime::~QDateTime(local_58);
      }
      if ((c.ucs & 1U) == 0) {
        local_70 = 0xaaaaaaaaaaaaaaaa;
        local_68 = 0xaaaaaaaaaaaaaaaa;
        local_60 = 0xaaaaaaaaaaaaaaaa;
        this_00 = in_RDX;
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffe20,
                   in_stack_fffffffffffffe1c);
        QUrl::host((QFlags_conflict *)&local_70);
        local_90 = 0xaaaaaaaaaaaaaaaa;
        local_88 = 0xaaaaaaaaaaaaaaaa;
        local_80 = 0xaaaaaaaaaaaaaaaa;
        QNetworkCookie::domain
                  ((QNetworkCookie *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
        QStringView::QStringView<QString,_true>
                  (this_00,(QString *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28))
        ;
        QStringView::QStringView<QString,_true>
                  (this_00,(QString *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28))
        ;
        domain_00.m_size._6_1_ = bVar1;
        domain_00.m_size._0_6_ = in_stack_fffffffffffffe50;
        domain_00.m_size._7_1_ = in_stack_fffffffffffffe57;
        domain_00.m_data = in_stack_fffffffffffffe58;
        QVar8.m_data = (storage_type_conflict *)pQVar9;
        QVar8.m_size = (qsizetype)in_RDI;
        bVar3 = isParentDomain(domain_00,QVar8);
        if (bVar3) {
          in_stack_fffffffffffffe20 = in_RDX;
          QFlags<QUrl::ComponentFormattingOption>::QFlags
                    ((QFlags<QUrl::ComponentFormattingOption> *)in_RDX,in_stack_fffffffffffffe1c);
          QUrl::path((QFlags_conflict *)local_d8);
          QStringView::QStringView<QString,_true>
                    (this_00,(QString *)
                             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
          QNetworkCookie::path
                    ((QNetworkCookie *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28)
                    );
          QStringView::QStringView<QString,_true>
                    (this_00,(QString *)
                             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
          path.m_data._0_4_ = in_stack_fffffffffffffe68;
          path.m_size = in_stack_fffffffffffffe60;
          path.m_data._4_4_ = in_stack_fffffffffffffe6c;
          reference.m_size._6_1_ = bVar1;
          reference.m_size._0_6_ = in_stack_fffffffffffffe50;
          reference.m_size._7_1_ = in_stack_fffffffffffffe57;
          reference.m_data = in_stack_fffffffffffffe58;
          bVar3 = isParentPath(path,reference);
          in_stack_fffffffffffffe2f = bVar3 ^ 0xff;
          QString::~QString((QString *)0x1c07bb);
          QString::~QString((QString *)0x1c07c8);
          if ((in_stack_fffffffffffffe2f & 1) == 0) {
            local_118 = -0x5555555555555556;
            local_110 = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
            QStringView::QStringView<QString,_true>
                      (this_00,(QString *)
                               CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
            QChar::QChar<char16_t,_true>(&local_11a,L'.');
            bVar3 = QStringView::startsWith(this_00,c);
            if (bVar3) {
              QVar8 = QStringView::sliced(this_00,CONCAT17(in_stack_fffffffffffffe2f,
                                                           in_stack_fffffffffffffe28));
              local_130 = QVar8.m_size;
              local_118 = local_130;
              local_128 = QVar8.m_data;
              local_110 = local_128;
            }
            QStringView::QStringView<QString,_true>
                      (this_00,(QString *)
                               CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
            bVar3 = ::operator!=(in_stack_fffffffffffffe20,
                                 (QStringView *)
                                 CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
            in_stack_fffffffffffffe1c = in_stack_fffffffffffffe1c & 0xffffff;
            if (bVar3) {
              domain_01.m_size._6_1_ = bVar2;
              domain_01.m_size._0_6_ = in_stack_fffffffffffffe80;
              domain_01.m_size._7_1_ = uVar10;
              domain_01.m_data = (storage_type_conflict *)pQVar5;
              bVar3 = qIsEffectiveTLD(domain_01);
              in_stack_fffffffffffffe1c = CONCAT13(bVar3,(int3)in_stack_fffffffffffffe1c);
            }
            if ((char)(in_stack_fffffffffffffe1c >> 0x18) == '\0') {
              QList<QNetworkCookie>::operator+=
                        ((QList<QNetworkCookie> *)in_stack_fffffffffffffe20,
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
              in_stack_fffffffffffffe68 = 0;
            }
            else {
              in_stack_fffffffffffffe68 = 3;
            }
          }
          else {
            in_stack_fffffffffffffe68 = 3;
          }
        }
        else {
          in_stack_fffffffffffffe68 = 3;
        }
        QString::~QString((QString *)0x1c092b);
        QString::~QString((QString *)0x1c0938);
      }
    }
    QList<QNetworkCookie>::const_iterator::operator++(&local_40);
  }
  iVar6 = QList<QNetworkCookie>::begin((QList<QNetworkCookie> *)in_stack_fffffffffffffe20);
  iVar7 = QList<QNetworkCookie>::end((QList<QNetworkCookie> *)in_stack_fffffffffffffe20);
  std::sort<QList<QNetworkCookie>::iterator,QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>
            (iVar6.i,iVar7.i);
  QDateTime::~QDateTime((QDateTime *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QNetworkCookie> QNetworkCookieJar::cookiesForUrl(const QUrl &url) const
{
//     \b Warning! This is only a dumb implementation!
//     It does NOT follow all of the recommendations from
//     http://wp.netscape.com/newsref/std/cookie_spec.html
//     It does not implement a very good cross-domain verification yet.

    Q_D(const QNetworkCookieJar);
    const QDateTime now = QDateTime::currentDateTimeUtc();
    QList<QNetworkCookie> result;
    const bool isEncrypted = url.scheme() == "https"_L1;

    // scan our cookies for something that matches
    for (const auto &cookie : std::as_const(d->allCookies)) {
        if (!isEncrypted && cookie.isSecure())
            continue;
        if (!cookie.isSessionCookie() && cookie.expirationDate() < now)
            continue;
        const QString urlHost = url.host();
        const QString cookieDomain = cookie.domain();
        if (!isParentDomain(urlHost, cookieDomain))
            continue;
        if (!isParentPath(url.path(), cookie.path()))
            continue;

        QStringView domain = cookieDomain;
        if (domain.startsWith(u'.')) /// Qt6?: remove when compliant with RFC6265
            domain = domain.sliced(1);
#if QT_CONFIG(topleveldomain)
        if (urlHost != domain && qIsEffectiveTLD(domain))
            continue;
#else
        if (!domain.contains(u'.') && urlHost != domain)
            continue;
#endif // topleveldomain

        result += cookie;
    }

    auto longerPath = [](const auto &c1, const auto &c2)
                      { return c1.path().size() > c2.path().size(); };
    std::sort(result.begin(), result.end(), longerPath);
    return result;
}